

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O3

void dump_slb(PowerPCCPU_conflict3 *cpu)

{
  return;
}

Assistant:

void dump_slb(PowerPCCPU *cpu)
{
    CPUPPCState *env = &cpu->env;
    int i;
    uint64_t slbe, slbv;

#if 0
    cpu_synchronize_state(CPU(cpu));

    qemu_printf("SLB\tESID\t\t\tVSID\n");
#endif
    for (i = 0; i < cpu->hash64_opts->slb_size; i++) {
        slbe = env->slb[i].esid;
        slbv = env->slb[i].vsid;
        if (slbe == 0 && slbv == 0) {
            continue;
        }
#if 0
        qemu_printf("%d\t0x%016" PRIx64 "\t0x%016" PRIx64 "\n",
                    i, slbe, slbv);
#endif
    }
}